

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

Construct * __thiscall
spvtools::val::Function::FindConstructForEntryBlock
          (Function *this,BasicBlock *entry_block,ConstructType type)

{
  bool bVar1;
  reference ppVar2;
  pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType> pVar3;
  Construct *construct_ptr;
  BasicBlock *local_48;
  ConstructType local_40;
  key_type local_38;
  _Node_iterator_base<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_true>
  local_28;
  iterator where;
  BasicBlock *pBStack_18;
  ConstructType type_local;
  BasicBlock *entry_block_local;
  Function *this_local;
  
  where.
  super__Node_iterator_base<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_true>
  ._M_cur._4_4_ = type;
  pBStack_18 = entry_block;
  entry_block_local = (BasicBlock *)this;
  pVar3 = std::make_pair<spvtools::val::BasicBlock_const*&,spvtools::val::ConstructType&>
                    (&stack0xffffffffffffffe8,
                     (ConstructType *)
                     ((long)&where.
                             super__Node_iterator_base<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_true>
                             ._M_cur + 4));
  local_48 = pVar3.first;
  local_40 = pVar3.second;
  local_38.first = local_48;
  local_38.second = local_40;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*,_spvtools::val::bb_constr_type_pair_hash,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>_>
       ::find(&this->entry_block_to_construct_,&local_38);
  construct_ptr =
       (Construct *)
       std::
       unordered_map<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*,_spvtools::val::bb_constr_type_pair_hash,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>_>
       ::end(&this->entry_block_to_construct_);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_true>
                      *)&construct_ptr);
  if (!bVar1) {
    __assert_fail("where != entry_block_to_construct_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                  ,0x137,
                  "Construct &spvtools::val::Function::FindConstructForEntryBlock(const BasicBlock *, ConstructType)"
                 );
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_false,_true>
           ::operator*((_Node_iterator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_false,_true>
                        *)&local_28);
  if (ppVar2->second != (Construct *)0x0) {
    return ppVar2->second;
  }
  __assert_fail("construct_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                ,0x139,
                "Construct &spvtools::val::Function::FindConstructForEntryBlock(const BasicBlock *, ConstructType)"
               );
}

Assistant:

Construct& Function::FindConstructForEntryBlock(const BasicBlock* entry_block,
                                                ConstructType type) {
  auto where =
      entry_block_to_construct_.find(std::make_pair(entry_block, type));
  assert(where != entry_block_to_construct_.end());
  auto construct_ptr = (*where).second;
  assert(construct_ptr);
  return *construct_ptr;
}